

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Mat *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  Mat top_blob_bordered;
  Mat top_blob_tm;
  int tiles;
  int h_tiles;
  int w_tiles;
  Mat bottom_blob_tm;
  Option opt_b;
  Mat bottom_blob_bordered;
  int outch;
  int outh;
  int outw;
  int inch;
  int h;
  int w;
  Option *in_stack_000022a8;
  Mat *in_stack_000022b0;
  Mat *in_stack_000022b8;
  int in_stack_000022c4;
  Mat *in_stack_000022c8;
  Allocator *in_stack_fffffffffffffb70;
  size_t in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  int _c;
  undefined8 *puVar6;
  undefined8 in_stack_fffffffffffffb88;
  void **ppvVar7;
  Mat *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  Mat *pMVar8;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  Mat *in_stack_fffffffffffffba8;
  Mat *in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbc0;
  Mat *opt_00;
  Option *in_stack_fffffffffffffbc8;
  Mat local_3f8;
  void *local_3b0;
  int *local_3a8;
  undefined8 local_3a0;
  undefined4 local_398;
  long *local_390;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  undefined8 local_370;
  Option *local_368;
  Mat *local_360;
  Mat *local_358;
  undefined4 local_350;
  Option *local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined8 local_328;
  int local_31c;
  int local_318;
  int local_314;
  void *local_310;
  int *local_308;
  undefined8 local_300;
  undefined4 local_2f8;
  long *local_2f0;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  Option *opt_01;
  Mat *bias_00;
  undefined4 uVar9;
  Mat *in_stack_fffffffffffffda0;
  Option *opt_02;
  Mat *in_stack_fffffffffffffdb0;
  Mat *in_stack_fffffffffffffdb8;
  
  _c = (int)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  iVar1 = in_RSI->w;
  iVar2 = in_RSI->h;
  opt_01 = (Option *)*in_RDI;
  bias_00 = (Mat *)in_RDI[1];
  pMVar8 = (Mat *)in_RDI[2];
  uVar9 = *(undefined4 *)(in_RDI + 3);
  opt_02 = (Option *)in_RDI[4];
  uVar9 = *(undefined4 *)(in_RDI + 5);
  uVar9 = *(undefined4 *)((long)in_RDI + 0x2c);
  uVar9 = *(undefined4 *)(in_RDI + 6);
  uVar9 = *(undefined4 *)((long)in_RDI + 0x34);
  if (bias_00 != (Mat *)0x0) {
    LOCK();
    *(int *)&bias_00->data = *(int *)&bias_00->data + 1;
    UNLOCK();
  }
  uVar3 = iVar1 + 3;
  if ((int)uVar3 < 0) {
    uVar3 = iVar1 + 6;
  }
  uVar3 = uVar3 & 0xfffffffc;
  uVar4 = iVar2 + 3;
  if ((int)uVar4 < 0) {
    uVar4 = iVar2 + 6;
  }
  uVar4 = uVar4 & 0xfffffffc;
  local_2b8 = *in_R8;
  uStack_2a8 = in_R8[2];
  uStack_2a0 = in_R8[3];
  local_298 = in_R8[4];
  uStack_290 = in_R8[5];
  uStack_288 = in_R8[6];
  uStack_280 = in_R8[7];
  uStack_2b0 = in_R8[2];
  copy_make_border(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
                   in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                   (int)in_stack_fffffffffffffb98,in_stack_fffffffffffffbc0,
                   (float)((ulong)in_stack_fffffffffffffb90 >> 0x20),in_stack_fffffffffffffbc8);
  local_310 = (void *)0x0;
  local_308 = (int *)0x0;
  local_300 = 0;
  local_2f8 = 0;
  local_2f0 = (long *)0x0;
  local_2e8 = 0;
  local_2e4 = 0;
  local_2e0 = 0;
  local_2dc = 0;
  local_2d8 = 0;
  local_2d0 = 0;
  uVar5 = uVar3;
  if ((int)uVar3 < 0) {
    uVar5 = uVar3 + 3;
  }
  local_314 = (int)uVar5 >> 2;
  uVar5 = uVar4;
  if ((int)uVar4 < 0) {
    uVar5 = uVar4 + 3;
  }
  local_318 = (int)uVar5 >> 2;
  local_31c = local_314 * local_318;
  Mat::create(in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
              (int)in_stack_fffffffffffffb88,_c,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70)
  ;
  conv3x3s1_winograd43_transform_input_sse
            (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,opt_02);
  local_368 = (Option *)0x0;
  local_360 = (Mat *)0x0;
  local_358 = (Mat *)0x0;
  local_350 = 0;
  local_348 = (Option *)0x0;
  local_340 = 0;
  local_33c = 0;
  local_338 = 0;
  local_334 = 0;
  local_330 = 0;
  local_328 = 0;
  if ((Option **)&stack0xfffffffffffffd88 != &local_368) {
    if (bias_00 != (Mat *)0x0) {
      LOCK();
      iVar1 = *(int *)&bias_00->data;
      *(int *)&bias_00->data = *(int *)&bias_00->data + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (opt_02 == (Option *)0x0) {
          if (opt_01 != (Option *)0x0) {
            free(opt_01);
          }
        }
        else {
          (**(code **)(*(long *)opt_02 + 0x18))(opt_02,opt_01);
        }
      }
    }
    uVar9 = 0;
    opt_01 = local_368;
    bias_00 = local_360;
    pMVar8 = local_358;
    opt_02 = local_348;
  }
  if (local_360 != (Mat *)0x0) {
    LOCK();
    iVar1 = *(int *)&local_360->data;
    *(int *)&local_360->data = *(int *)&local_360->data + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_348 == (Option *)0x0) {
        if (local_368 != (Option *)0x0) {
          free(local_368);
        }
      }
      else {
        (**(code **)(*(long *)local_348 + 0x18))(local_348,local_368);
      }
    }
  }
  local_368 = (Option *)0x0;
  local_358 = (Mat *)0x0;
  local_350 = 0;
  local_340 = 0;
  local_33c = 0;
  local_338 = 0;
  local_334 = 0;
  local_330 = 0;
  local_328 = 0;
  local_360 = (Mat *)0x0;
  local_3b0 = (void *)0x0;
  local_3a8 = (int *)0x0;
  local_3a0 = 0;
  local_398 = 0;
  local_390 = (long *)0x0;
  local_388 = 0;
  local_384 = 0;
  local_380 = 0;
  local_37c = 0;
  local_378 = 0;
  local_370 = 0;
  convolution_winograd_dot_sse
            (in_stack_000022c8,in_stack_000022c4,in_stack_000022b8,in_stack_000022b0,
             in_stack_000022a8);
  opt_00 = &local_3f8;
  local_3f8.data = (void *)0x0;
  local_3f8.refcount = (int *)0x0;
  local_3f8.elemsize = 0;
  local_3f8.elempack = 0;
  local_3f8.allocator = (Allocator *)0x0;
  local_3f8.dims = 0;
  local_3f8.w = 0;
  local_3f8.h = 0;
  local_3f8.d = 0;
  local_3f8.c = 0;
  local_3f8.cstep = 0;
  if ((uVar3 == in_RSI->w) && (uVar4 == in_RSI->h)) {
    if (&local_3f8 != in_RSI) {
      if (in_RSI->refcount != (int *)0x0) {
        LOCK();
        *in_RSI->refcount = *in_RSI->refcount + 1;
        UNLOCK();
      }
      local_3f8.data = in_RSI->data;
      local_3f8.refcount = in_RSI->refcount;
      local_3f8.elemsize = in_RSI->elemsize;
      local_3f8.elempack = in_RSI->elempack;
      local_3f8.allocator = in_RSI->allocator;
      local_3f8.dims = in_RSI->dims;
      local_3f8.w = in_RSI->w;
      local_3f8.h = in_RSI->h;
      local_3f8.d = in_RSI->d;
      local_3f8.c = in_RSI->c;
      local_3f8.cstep = in_RSI->cstep;
      in_stack_fffffffffffffbb0 = &local_3f8;
    }
  }
  else {
    Mat::create(in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                (int)in_stack_fffffffffffffb88,_c,in_stack_fffffffffffffb78,
                in_stack_fffffffffffffb70);
  }
  conv3x3s1_winograd43_transform_output_sse(in_stack_fffffffffffffda0,pMVar8,bias_00,opt_01);
  copy_cut_border(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
                  in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                  (int)in_stack_fffffffffffffb98,(Option *)opt_00);
  pMVar8 = &local_3f8;
  if (local_3f8.refcount != (int *)0x0) {
    LOCK();
    iVar1 = *local_3f8.refcount;
    *local_3f8.refcount = *local_3f8.refcount + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_3f8.allocator == (Allocator *)0x0) {
        if (local_3f8.data != (void *)0x0) {
          free(local_3f8.data);
        }
      }
      else {
        (*(local_3f8.allocator)->_vptr_Allocator[3])(local_3f8.allocator,local_3f8.data);
      }
    }
  }
  pMVar8->data = (void *)0x0;
  pMVar8->elemsize = 0;
  pMVar8->elempack = 0;
  pMVar8->dims = 0;
  pMVar8->w = 0;
  pMVar8->h = 0;
  pMVar8->d = 0;
  pMVar8->c = 0;
  pMVar8->cstep = 0;
  pMVar8->refcount = (int *)0x0;
  ppvVar7 = &local_3b0;
  if (local_3a8 != (int *)0x0) {
    LOCK();
    iVar1 = *local_3a8;
    *local_3a8 = *local_3a8 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_390 == (long *)0x0) {
        if (local_3b0 != (void *)0x0) {
          free(local_3b0);
        }
      }
      else {
        (**(code **)(*local_390 + 0x18))(local_390,local_3b0);
      }
    }
  }
  *ppvVar7 = (void *)0x0;
  ppvVar7[2] = (void *)0x0;
  *(undefined4 *)(ppvVar7 + 3) = 0;
  *(undefined4 *)(ppvVar7 + 5) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
  *(undefined4 *)(ppvVar7 + 6) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
  *(undefined4 *)(ppvVar7 + 7) = 0;
  ppvVar7[8] = (void *)0x0;
  ppvVar7[1] = (void *)0x0;
  ppvVar7 = &local_310;
  if (local_308 != (int *)0x0) {
    LOCK();
    iVar1 = *local_308;
    *local_308 = *local_308 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_2f0 == (long *)0x0) {
        if (local_310 != (void *)0x0) {
          free(local_310);
        }
      }
      else {
        (**(code **)(*local_2f0 + 0x18))(local_2f0,local_310);
      }
    }
  }
  *ppvVar7 = (void *)0x0;
  ppvVar7[2] = (void *)0x0;
  *(undefined4 *)(ppvVar7 + 3) = 0;
  *(undefined4 *)(ppvVar7 + 5) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
  *(undefined4 *)(ppvVar7 + 6) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
  *(undefined4 *)(ppvVar7 + 7) = 0;
  ppvVar7[8] = (void *)0x0;
  ppvVar7[1] = (void *)0x0;
  puVar6 = (undefined8 *)&stack0xfffffffffffffd88;
  if (bias_00 != (Mat *)0x0) {
    LOCK();
    iVar1 = *(int *)&bias_00->data;
    *(int *)&bias_00->data = *(int *)&bias_00->data + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (opt_02 == (Option *)0x0) {
        if (opt_01 != (Option *)0x0) {
          free(opt_01);
        }
      }
      else {
        (**(code **)(*(long *)opt_02 + 0x18))(opt_02,opt_01);
      }
    }
  }
  *puVar6 = 0;
  puVar6[2] = 0;
  *(undefined4 *)(puVar6 + 3) = 0;
  *(undefined4 *)(puVar6 + 5) = 0;
  *(undefined4 *)((long)puVar6 + 0x2c) = 0;
  *(undefined4 *)(puVar6 + 6) = 0;
  *(undefined4 *)((long)puVar6 + 0x34) = 0;
  *(undefined4 *)(puVar6 + 7) = 0;
  puVar6[8] = 0;
  puVar6[1] = 0;
  return;
}

Assistant:

static void conv3x3s1_winograd43_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2, winograd F(4,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;

    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 4;
        int h_tiles = outh / 4;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 36, inch, 4u, opt.workspace_allocator);
        conv3x3s1_winograd43_transform_input_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd43_transform_output_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}